

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_key_size_helper(char *buf,size_t buf_size,char *name)

{
  int iVar1;
  int ret;
  size_t n;
  char *p;
  char *name_local;
  size_t buf_size_local;
  char *buf_local;
  
  iVar1 = snprintf(buf,buf_size,"%s key size",name);
  if ((iVar1 < 0) || (buf_size <= (ulong)(long)iVar1)) {
    buf_local._4_4_ = -0x2980;
  }
  else {
    buf_local._4_4_ = 0;
  }
  return buf_local._4_4_;
}

Assistant:

int mbedtls_x509_key_size_helper(char *buf, size_t buf_size, const char *name)
{
    char *p = buf;
    size_t n = buf_size;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    ret = mbedtls_snprintf(p, n, "%s key size", name);
    MBEDTLS_X509_SAFE_SNPRINTF;

    return 0;
}